

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnp.cpp
# Opt level: O3

int rs2LinProjection(Vector3d *X,Vector2d *u,Vector3d *v,Vector3d *C,Vector3d *w,Vector3d *t,
                    double f,double rd,double r0,int direction)

{
  double dVar1;
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  long lVar5;
  int iVar6;
  ActualDstType actualDst;
  double dVar7;
  double dVar10;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  Matrix3d K;
  Vector3d *local_1f8;
  double local_1f0 [4];
  double *pdStack_1d0;
  double local_1c8;
  double dStack_1c0;
  double local_1b8;
  double dStack_1b0;
  double local_1a8;
  double local_178;
  double dStack_170;
  undefined1 local_168 [16];
  Vector3d local_158;
  double local_138;
  double dStack_130;
  double dStack_128;
  double local_120;
  double dStack_118;
  double local_110;
  double dStack_108;
  double local_100;
  double local_f8 [4];
  undefined1 local_d8 [16];
  double local_c8;
  double dStack_c0;
  double local_b8;
  double dStack_b0;
  double local_a8;
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  double dStack_78;
  double local_70;
  double local_68;
  double dStack_60;
  double local_58;
  Vector3d local_48;
  
  local_120 = 0.0;
  local_110 = 0.0;
  dStack_108 = 0.0;
  dStack_130 = 0.0;
  dStack_128 = 0.0;
  local_100 = 0.0;
  local_f8[0] = 1.0;
  local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (v->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[0];
  local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (v->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[1];
  local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (v->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[2];
  local_1f8 = t;
  local_1f0[0] = rd;
  local_138 = f;
  dStack_118 = f;
  X_(&local_48);
  local_f8[2] = local_1f0[1] + 1.0;
  local_f8[3] = local_1f0[2] + 0.0;
  local_d8._8_4_ = SUB84((double)pdStack_1d0 + 0.0,0);
  local_d8._0_8_ = local_1f0[3] + 0.0;
  local_d8._12_4_ = (int)((ulong)((double)pdStack_1d0 + 0.0) >> 0x20);
  local_c8 = local_1c8 + 1.0;
  dStack_c0 = dStack_1c0 + 0.0;
  local_b8 = local_1b8 + 0.0;
  dStack_b0 = dStack_1b0 + 0.0;
  local_a8 = local_1a8 + 1.0;
  dVar14 = (X->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
           [0];
  dVar7 = (X->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
          [1];
  dVar10 = (X->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
           [2];
  local_1f0[1] = (C->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
                 array[0] +
                 dVar10 * local_b8 + dVar7 * (double)local_d8._8_8_ + dVar14 * local_f8[2];
  local_1f0[2] = (C->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
                 array[1] + dVar10 * dStack_b0 + dVar7 * local_c8 + dVar14 * local_f8[3];
  local_1f0[3] = (local_1f0[3] + 0.0) * dVar14 + local_a8 * dVar10 + dStack_c0 * dVar7 +
                 (C->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
                 array[2];
  auVar15._0_8_ = local_1f0[3] * 0.0 + local_1f0[2] * local_120 + local_1f0[1] * local_138;
  auVar15._8_8_ = local_1f0[3] * 0.0 + local_1f0[2] * dStack_118 + local_1f0[1] * dStack_130;
  dVar14 = local_1f0[3] * local_f8[0] + local_1f0[2] * local_110 + dStack_128 * local_1f0[1];
  auVar9._8_4_ = SUB84(dVar14,0);
  auVar9._0_8_ = dVar14;
  auVar9._12_4_ = (int)((ulong)dVar14 >> 0x20);
  local_168 = divpd(auVar15,auVar9);
  *(undefined1 (*) [16])
   (u->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.array =
       local_168;
  dVar14 = 1e+15;
  iVar6 = 0;
  do {
    pdStack_1d0 = &local_138;
    if (dVar14 <= 1e-10) {
      return 0;
    }
    local_178 = local_168._8_8_ * local_168._8_8_;
    local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = (u->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.array
           [direction];
    local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = (w->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
           [0] * local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2];
    local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = (w->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
           [1] * local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2];
    local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[2] *
           (w->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
           [2];
    dStack_170 = local_178;
    X_(&local_158);
    dVar14 = (u->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
             array[direction];
    dVar7 = local_98 + 1.0;
    dVar10 = dStack_90 + 0.0;
    dVar13 = dStack_80 + 0.0;
    dVar16 = dStack_78 + 1.0;
    dVar11 = local_88 + 0.0;
    dVar12 = local_70 + 0.0;
    dVar17 = local_68 + 0.0;
    dVar18 = dStack_60 + 0.0;
    dVar19 = local_58 + 1.0;
    lVar5 = 0x10;
    do {
      dVar1 = *(double *)((long)local_f8 + lVar5 + 0x10);
      dVar3 = *(double *)((long)local_f8 + lVar5);
      dVar4 = *(double *)((long)local_f8 + lVar5 + 8);
      *(double *)((long)&local_1f8 + lVar5) = dVar4 * dVar13 + dVar3 * dVar7 + dVar1 * dVar17;
      *(double *)((long)local_1f0 + lVar5) = dVar4 * dVar16 + dVar3 * dVar10 + dVar1 * dVar18;
      *(double *)((long)local_1f0 + lVar5 + 8) = dVar12 * dVar4 + dVar1 * dVar19 + dVar11 * dVar3;
      lVar5 = lVar5 + 0x18;
    } while (lVar5 != 0x58);
    dVar7 = (X->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
            [0];
    dVar10 = (X->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
             array[1];
    dVar11 = (X->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
             array[2];
    local_1f0[1] = (local_1f8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                   m_storage.m_data.array[0] * dVar14 +
                   (C->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                   m_data.array[0] +
                   dVar11 * local_1b8 + (double)pdStack_1d0 * dVar10 + dVar7 * local_1f0[1];
    local_1f0[2] = (local_1f8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                   m_storage.m_data.array[1] * dVar14 +
                   (C->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                   m_data.array[1] + dVar11 * dStack_1b0 + local_1c8 * dVar10 + dVar7 * local_1f0[2]
    ;
    local_1f0[3] = dVar14 * (local_1f8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                            ).m_storage.m_data.array[2] +
                   local_1a8 * dVar11 + dStack_1c0 * dVar10 + dVar7 * local_1f0[3] +
                   (C->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                   m_data.array[2];
    auVar8._0_8_ = local_1f0[3] * dStack_108 + local_1f0[2] * local_120 + local_1f0[1] * local_138;
    auVar8._8_8_ = local_1f0[3] * local_100 + local_1f0[2] * dStack_118 + local_1f0[1] * dStack_130;
    dVar14 = local_1f0[3] * local_f8[0] + local_1f0[2] * local_110 + dStack_128 * local_1f0[1];
    auVar2._8_4_ = SUB84(dVar14,0);
    auVar2._0_8_ = dVar14;
    auVar2._12_4_ = (int)((ulong)dVar14 >> 0x20);
    auVar9 = divpd(auVar8,auVar2);
    dVar14 = ((double)local_168._0_8_ * (double)local_168._0_8_ + local_178) * local_1f0[0] + 1.0;
    local_168._0_8_ = dVar14 * auVar9._0_8_;
    local_168._8_8_ = dVar14 * auVar9._8_8_;
    dVar14 = (u->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
             array[0] - (double)local_168._0_8_;
    dVar7 = (u->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.array
            [1] - local_168._8_8_;
    dVar14 = SQRT(dVar7 * dVar7 + dVar14 * dVar14);
    *(undefined1 (*) [16])
     (u->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.array =
         local_168;
    iVar6 = iVar6 + 1;
  } while (iVar6 != 0x66);
  return 2;
}

Assistant:

int rs2LinProjection(const Eigen::Vector3d &X, Eigen::Vector2d &u, const Eigen::Vector3d &v, const Eigen::Vector3d &C, const Eigen::Vector3d &w, const Eigen::Vector3d &t, double f, double rd, double r0, int direction){
    // First initiate u with a global shutter projection
    Eigen::Matrix<double,3,4> P;
    Eigen::Vector3d uh;
    Eigen::Matrix3d K = Eigen::Matrix3d::Zero();
    K.diagonal() << f, f, 1;
    Eigen::Matrix3d Rv = Eigen::Matrix3d::Identity() + X_(v); 
    uh = K* ( Rv * X + C );
    u = uh.head(2)/uh(2);


    double diff = 1e15;

    int niter = 0;

    Eigen::Vector3d temp;

    while(diff > 1e-10 ){
        double rc2 = u(0)*u(0) + u(1)*u(1);
        temp = K * ((Eigen::Matrix3d::Identity() + X_(u(direction) * w)) * Rv * X + C + u(direction) * t);
        temp = temp/temp(2);
        temp.head(2) *= (1 + rd * rc2);
        diff = (u - temp.head(2)).norm();
        u = temp.head(2);
        if(niter > 100){
            return WARN_NO_CONVERGENCE;
        }
        niter++;
    }

    return 0;
    
}